

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O2

void __thiscall RVO::Plane::Plane(Plane *this,Plane *param_2)

{
  (this->point).val_[0] = (param_2->point).val_[0];
  (this->point).val_[1] = (param_2->point).val_[1];
  (this->point).val_[2] = (param_2->point).val_[2];
  (this->normal).val_[0] = (param_2->normal).val_[0];
  (this->normal).val_[1] = (param_2->normal).val_[1];
  (this->normal).val_[2] = (param_2->normal).val_[2];
  return;
}

Assistant:

RVO_API inline float operator[](size_t i) const { return val_[i]; }